

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O2

double Minisat::memUsedPeak(bool strictlyPeak)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  double dVar3;
  int peak_kb;
  char name [256];
  int local_12c;
  char local_128 [264];
  
  uVar1 = getpid();
  sprintf(local_128,"/proc/%d/status",(ulong)uVar1);
  __stream = fopen(local_128,"rb");
  dVar3 = 0.0;
  if (__stream != (FILE *)0x0) {
    local_12c = 0;
    do {
      iVar2 = feof(__stream);
      if ((iVar2 != 0) || (iVar2 = __isoc99_fscanf(__stream,"VmPeak: %d kB",&local_12c), iVar2 == 1)
         ) goto LAB_0010dbe5;
      do {
        iVar2 = feof(__stream);
        if (iVar2 != 0) break;
        iVar2 = fgetc(__stream);
      } while (iVar2 != 10);
    } while( true );
  }
LAB_0010dbff:
  if (dVar3 == 0.0 && !strictlyPeak) {
    dVar3 = memUsed();
  }
  return dVar3;
LAB_0010dbe5:
  fclose(__stream);
  dVar3 = (double)local_12c * 0.0009765625;
  goto LAB_0010dbff;
}

Assistant:

double Minisat::memUsedPeak(bool strictlyPeak) { 
    double peak = memReadPeak() / (double)1024;
    return peak == 0 && !strictlyPeak ? memUsed() : peak; }